

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

Diagnostics * __thiscall
slang::DiagnosticEngine::setMappingsFromPragmas
          (Diagnostics *__return_storage_ptr__,DiagnosticEngine *this)

{
  char_pointer puVar1;
  pthread_rwlock_t *__rwlock;
  pointer pDVar2;
  uint uVar3;
  char_pointer puVar4;
  uint uVar5;
  char_pointer puVar7;
  type *buffer;
  undefined1 auVar8 [16];
  iterator iVar9;
  span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL> directives;
  table_element_pointer_conflict ppVar6;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  __rwlock = (pthread_rwlock_t *)this->sourceManager;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  iVar9 = boost::unordered::detail::foa::
          table<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>
          ::begin((table<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>
                   *)&__rwlock[5].__data);
  ppVar6 = iVar9.p_;
joined_r0x0024ef3e:
  if (ppVar6 == (table_element_pointer_conflict)0x0) {
    pthread_rwlock_unlock(__rwlock);
    return __return_storage_ptr__;
  }
  ppVar6 = iVar9.p_;
  pDVar2 = (ppVar6->second).
           super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  directives._M_extent._M_extent_value =
       (long)(ppVar6->second).
             super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 5;
  directives._M_ptr = pDVar2;
  setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
            (this,(BufferID)(ppVar6->first).id,directives,__return_storage_ptr__);
  puVar4 = iVar9.pc_ + 2;
  do {
    puVar7 = puVar4;
    puVar4 = iVar9.pc_;
    ppVar6 = iVar9.p_ + 1;
    if (((uint)iVar9.pc_ & 0xf) == 0xe) goto LAB_0024efa7;
    puVar1 = puVar7 + -1;
    iVar9.p_ = ppVar6;
    iVar9.pc_ = puVar4 + 1;
    puVar4 = puVar7 + 1;
  } while (*puVar1 == '\0');
  puVar7 = puVar7 + -1;
  if (*puVar1 == '\x01') {
    ppVar6 = (table_element_pointer_conflict)0x0;
  }
  goto LAB_0024ef9b;
LAB_0024efa7:
  do {
    auVar8[0] = -(*puVar7 == '\0');
    auVar8[1] = -(puVar7[1] == '\0');
    auVar8[2] = -(puVar7[2] == '\0');
    auVar8[3] = -(puVar7[3] == '\0');
    auVar8[4] = -(puVar7[4] == '\0');
    auVar8[5] = -(puVar7[5] == '\0');
    auVar8[6] = -(puVar7[6] == '\0');
    auVar8[7] = -(puVar7[7] == '\0');
    auVar8[8] = -(puVar7[8] == '\0');
    auVar8[9] = -(puVar7[9] == '\0');
    auVar8[10] = -(puVar7[10] == '\0');
    auVar8[0xb] = -(puVar7[0xb] == '\0');
    auVar8[0xc] = -(puVar7[0xc] == '\0');
    auVar8[0xd] = -(puVar7[0xd] == '\0');
    auVar8[0xe] = -(puVar7[0xe] == '\0');
    auVar8[0xf] = -(puVar7[0xf] == '\0');
    uVar5 = (uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe);
    if (uVar5 == 0x7fff) {
      puVar7 = puVar7 + 0x10;
      ppVar6 = ppVar6 + 0xf;
    }
    else {
      uVar3 = 0;
      if ((uVar5 ^ 0x7fff) != 0) {
        for (; ((uVar5 ^ 0x7fff) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if (puVar7[uVar3] == '\x01') {
        ppVar6 = (table_element_pointer_conflict)0x0;
      }
      else {
        puVar7 = puVar7 + uVar3;
        ppVar6 = (table_element_pointer_conflict)((long)&(ppVar6->first).id + (ulong)(uVar3 << 5));
      }
    }
  } while (uVar5 == 0x7fff);
LAB_0024ef9b:
  iVar9.p_ = ppVar6;
  iVar9.pc_ = puVar7;
  goto joined_r0x0024ef3e;
}

Assistant:

Diagnostics DiagnosticEngine::setMappingsFromPragmas() {
    Diagnostics diags;
    sourceManager.visitDiagnosticDirectives([&](BufferID buffer, auto& directives) {
        setMappingsFromPragmasImpl<SourceManager::DiagnosticDirectiveInfo>(buffer, directives,
                                                                           diags);
    });

    return diags;
}